

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ElabSystemTaskSyntax::setChild
          (ElabSystemTaskSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  ArgumentListSyntax *pAVar4;
  logic_error *this_00;
  Token TVar5;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 4) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar5.kind;
      (this->name).field_0x2 = TVar5._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->name).rawLen = TVar5.rawLen;
      (this->name).info = TVar5.info;
      break;
    case 2:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pAVar4 = (ArgumentListSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pAVar4 = SyntaxNode::as<slang::syntax::ArgumentListSyntax>(pSVar3);
      }
      this->arguments = pAVar4;
      break;
    case 3:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->semi).kind = TVar5.kind;
      (this->semi).field_0x2 = TVar5._2_1_;
      (this->semi).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->semi).rawLen = TVar5.rawLen;
      (this->semi).info = TVar5.info;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_d8,0x1312);
  std::operator+(&local_78,&local_98,&local_d8);
  std::operator+(&local_58,&local_78,": ");
  std::operator+(&local_38,&local_58,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ElabSystemTaskSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: name = child.token(); return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}